

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_feat(parser *p)

{
  bool bVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  parser_error pVar8;
  
  pcVar5 = parser_getsym(p,"idx");
  pcVar6 = (char *)parser_priv(p);
  if (pcVar6 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x326,"enum parser_error parse_prefs_feat(struct parser *)");
  }
  pVar8 = PARSE_ERROR_NONE;
  if (*pcVar6 == '\0') {
    wVar2 = lookup_feat_code(pcVar5);
    if (wVar2 < L'\0') {
      wVar2 = lookup_feat(pcVar5);
    }
    pVar8 = PARSE_ERROR_OUT_OF_BOUNDS;
    if ((uint)wVar2 < 0x19) {
      pcVar5 = parser_getsym(p,"lighting");
      iVar3 = strcmp(pcVar5,"torch");
      bVar1 = true;
      if (iVar3 == 0) {
        iVar3 = 1;
      }
      else {
        iVar3 = strcmp(pcVar5,"los");
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = strcmp(pcVar5,"lit");
          if (iVar3 == 0) {
            iVar3 = 2;
          }
          else {
            iVar3 = strcmp(pcVar5,"dark");
            if (iVar3 == 0) {
              iVar3 = 3;
            }
            else {
              iVar3 = strcmp(pcVar5,"*");
              if (iVar3 != 0) {
                return PARSE_ERROR_INVALID_LIGHTING;
              }
              iVar3 = 4;
              bVar1 = false;
            }
          }
        }
      }
      if (bVar1) {
        wVar4 = parser_getint(p,"attr");
        *(char *)(*(long *)((long)feat_x_attr + (ulong)(uint)(iVar3 << 3)) + (ulong)(uint)wVar2) =
             (char)wVar4;
        wVar4 = parser_getint(p,"char");
        *(wchar_t *)
         (*(long *)((long)feat_x_char + (ulong)(uint)(iVar3 << 3)) + (ulong)(uint)wVar2 * 4) = wVar4
        ;
        pVar8 = PARSE_ERROR_NONE;
      }
      else {
        pVar8 = PARSE_ERROR_NONE;
        lVar7 = 0;
        do {
          wVar4 = parser_getint(p,"attr");
          *(char *)(*(long *)((long)feat_x_attr + lVar7) + (ulong)(uint)wVar2) = (char)wVar4;
          wVar4 = parser_getint(p,"char");
          *(wchar_t *)(*(long *)((long)feat_x_char + lVar7) + (ulong)(uint)wVar2 * 4) = wVar4;
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x20);
      }
    }
  }
  return pVar8;
}

Assistant:

static enum parser_error parse_prefs_feat(struct parser *p)
{
	const char *sym = parser_getsym(p, "idx");
	int idx;
	const char *lighting;
	int light_idx;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	idx = lookup_feat_code(sym);
	if (idx < 0) {
		/*
		 * To tolerate user preference files written before the
		 * post 4.2.4 change that introduced terrain codes,
		 * try looking up by the feature's printable name.  This
		 * could be dropped when a future version (4.3.*) drops
		 * save file compatibility.
		 */
		idx = lookup_feat(sym);
	}
	if (idx < 0 || idx >= FEAT_MAX) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}

	lighting = parser_getsym(p, "lighting");
	if (streq(lighting, "torch"))
		light_idx = LIGHTING_TORCH;
	else if (streq(lighting, "los"))
		light_idx = LIGHTING_LOS;
	else if (streq(lighting, "lit"))
		light_idx = LIGHTING_LIT;
	else if (streq(lighting, "dark"))
		light_idx = LIGHTING_DARK;
	else if (streq(lighting, "*"))
		light_idx = LIGHTING_MAX;
	else
		return PARSE_ERROR_INVALID_LIGHTING;

	if (light_idx < LIGHTING_MAX) {
		feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
		feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
	} else {
		for (light_idx = 0; light_idx < LIGHTING_MAX; light_idx++) {
			feat_x_attr[light_idx][idx] = (uint8_t)parser_getint(p, "attr");
			feat_x_char[light_idx][idx] = (wchar_t)parser_getint(p, "char");
		}
	}

	return PARSE_ERROR_NONE;
}